

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

int tcu::getNumUsedChannels(ChannelOrder order)

{
  int local_c;
  ChannelOrder order_local;
  
  switch(order) {
  case R:
    local_c = 1;
    break;
  case A:
    local_c = 1;
    break;
  case I:
    local_c = 1;
    break;
  case L:
    local_c = 1;
    break;
  case LA:
    local_c = 2;
    break;
  case RG:
    local_c = 2;
    break;
  case RA:
    local_c = 2;
    break;
  case RGB:
    local_c = 3;
    break;
  case RGBA:
    local_c = 4;
    break;
  case ARGB:
    local_c = 4;
    break;
  case BGR:
    local_c = 3;
    break;
  case BGRA:
    local_c = 4;
    break;
  case sR:
    local_c = 1;
    break;
  case sRG:
    local_c = 2;
    break;
  case sRGB:
    local_c = 3;
    break;
  case sRGBA:
    local_c = 4;
    break;
  case sBGR:
    local_c = 3;
    break;
  case sBGRA:
    local_c = 4;
    break;
  case D:
    local_c = 1;
    break;
  case S:
    local_c = 1;
    break;
  case DS:
    local_c = 2;
    break;
  default:
    local_c = 0;
  }
  return local_c;
}

Assistant:

int getNumUsedChannels (TextureFormat::ChannelOrder order)
{
	// make sure this table is updated if type table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELORDER_LAST == 21);

	switch (order)
	{
		case TextureFormat::R:			return 1;
		case TextureFormat::A:			return 1;
		case TextureFormat::I:			return 1;
		case TextureFormat::L:			return 1;
		case TextureFormat::LA:			return 2;
		case TextureFormat::RG:			return 2;
		case TextureFormat::RA:			return 2;
		case TextureFormat::RGB:		return 3;
		case TextureFormat::RGBA:		return 4;
		case TextureFormat::ARGB:		return 4;
		case TextureFormat::BGR:		return 3;
		case TextureFormat::BGRA:		return 4;
		case TextureFormat::sR:			return 1;
		case TextureFormat::sRG:		return 2;
		case TextureFormat::sRGB:		return 3;
		case TextureFormat::sRGBA:		return 4;
		case TextureFormat::sBGR:		return 3;
		case TextureFormat::sBGRA:		return 4;
		case TextureFormat::D:			return 1;
		case TextureFormat::S:			return 1;
		case TextureFormat::DS:			return 2;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}